

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,void *this,Vector<float,_4> *v)

{
  ostream *poVar1;
  bool *pbVar2;
  int i;
  long lVar3;
  ostringstream s;
  undefined1 auStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"[",1);
  lVar3 = 0;
  do {
    poVar1 = std::ostream::_M_insert<double>((double)*(float *)((long)this + lVar3 * 4));
    pbVar2 = glcts::fixed_sample_locations_values + 1;
    if (lVar3 != 3) {
      pbVar2 = (bool *)0x1cfbcfd;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pbVar2,(ulong)(lVar3 != 3));
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
  std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T v)
	{
		std::ostringstream s;
		s << "[";
		for (int i = 0; i < 4; ++i)
			s << v[i] << (i == 3 ? "" : ",");
		s << "]";
		return s.str();
	}